

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O2

void __thiscall b_tree_node::_insert_non_full(b_tree_node *this,int64_t k,int64_t v)

{
  int64_t *piVar1;
  long lVar2;
  ulong uVar3;
  uint8_t *puVar4;
  runtime_error *this_00;
  uint uVar5;
  ulong uVar7;
  uint uVar8;
  b_tree_node new_child;
  b_tree_node child;
  ulong uVar6;
  
  uVar3 = (ulong)*this->_num_keys_field;
  if (*this->_leaf_field == 0) {
    uVar5 = (uint)*this->_num_keys_field;
    do {
      uVar5 = uVar5 - 1;
      uVar8 = 0xffffffff;
      if ((int)uVar5 < 0) break;
      uVar8 = uVar5;
    } while (k < this->_keys_field[uVar5]);
    uVar5 = uVar8 + 1;
    b_tree_node(&child,this->_p,this->_child_ofs_field[uVar5 & 0xffff]);
    if (((uint)*this->_min_degree_field * 2 - 1 == (uint)*child._num_keys_field) &&
       (_split_child(this,uVar5,this->_child_ofs_field[uVar5 & 0xffff]),
       this->_keys_field[uVar5] < k)) {
      uVar8 = uVar5;
    }
    b_tree_node(&new_child,this->_p,this->_child_ofs_field[(long)(int)uVar8 + 1]);
    _insert_non_full(&new_child,k,v);
    r_memory_map::~r_memory_map(&new_child._mm);
    r_memory_map::~r_memory_map(&child._mm);
  }
  else {
    while( true ) {
      uVar6 = uVar3 - 1;
      piVar1 = this->_keys_field;
      if ((int)uVar6 < 0) break;
      uVar7 = uVar6 & 0xffffffff;
      lVar2 = piVar1[uVar7];
      if (lVar2 <= k) {
        puVar4 = this->_valid_keys_field;
        if ((lVar2 == k) && (puVar4[uVar7] == '\x01')) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Duplicate key");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00108267;
      }
      piVar1[uVar3] = lVar2;
      this->_valid_keys_field[uVar3] = this->_valid_keys_field[uVar7];
      this->_vals_field[uVar3] = this->_vals_field[uVar7];
      uVar3 = uVar6;
    }
    puVar4 = this->_valid_keys_field;
    uVar6 = 0xffffffffffffffff;
LAB_00108267:
    uVar5 = (int)uVar6 + 1;
    piVar1[uVar5] = k;
    puVar4[uVar5] = '\x01';
    this->_vals_field[uVar5] = v;
    *this->_num_keys_field = *this->_num_keys_field + 1;
  }
  return;
}

Assistant:

void b_tree_node::_insert_non_full(int64_t k, int64_t v)
{
    // Initialize index as index of rightmost element
    int i = _num_keys()-1;
 
    // If this is a leaf node
    if (_leaf())
    {
        // The following loop does two things
        // a) Finds the location of new key to be inserted
        // b) Moves all greater keys to one place ahead
        while (i >= 0 && _keys_field[i] > k)
        {
            _keys_field[i+1] = _keys_field[i];
            _valid_keys_field[i+1] = _valid_keys_field[i];
            _vals_field[i+1] = _vals_field[i];
            i--;
        }

        if(i >= 0 && (_keys_field[i] == k && _valid_keys_field[i] == 1))
            throw runtime_error("Duplicate key");
 
        // Insert the new key at found location
        _keys_field[i+1] = k;
        _valid_keys_field[i+1] = 1;
        _vals_field[i+1] = v;
        _set_num_keys(_num_keys() + 1);
    }
    else // If this node is not leaf
    {
        // Find the child which is going to have the new key
        while (i >= 0 && _keys_field[i] > k)
            i--;
 
        b_tree_node child(_p, _child_ofs(i+1));
        // See if the found child is full
        if (child._num_keys() == 2*_min_degree() - 1)
        {
            // If the child is full, then split it
            _split_child(i+1, _child_ofs(i+1));
 
            // After split, the middle key of _child_ofs[i] goes up and
            // _child_ofs[i] is splitted into two.  See which of the two
            // is going to have the new key
            if (_keys_field[i+1] < k)
                i++;
        }

        b_tree_node new_child(_p, _child_ofs_field[i+1]);
        new_child._insert_non_full(k, v);
    }
}